

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>
::dx(FadBinaryMul<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>
     *this,int i)

{
  Fad<double> *pFVar1;
  Fad<double> *pFVar2;
  double *pdVar3;
  double *pdVar4;
  
  pFVar1 = (this->left_->fadexpr_).right_;
  pdVar4 = &pFVar1->defaultVal;
  if ((pFVar1->dx_).num_elts != 0) {
    pdVar4 = (pFVar1->dx_).ptr_to_data + i;
  }
  pFVar2 = (this->right_->fadexpr_).right_;
  pdVar3 = &pFVar2->defaultVal;
  if ((pFVar2->dx_).num_elts != 0) {
    pdVar3 = (pFVar2->dx_).ptr_to_data + i;
  }
  return ((this->right_->fadexpr_).left_.constant_ - pFVar2->val_) * -*pdVar4 -
         ((this->left_->fadexpr_).left_.constant_ - pFVar1->val_) * *pdVar3;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}